

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseProblem.h
# Opt level: O1

void covenant::parse_problem<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
               (CFGProblem *p,StrParse *input,shared_ptr<covenant::TerminalFactory> *tfac)

{
  char cVar1;
  ulong uVar2;
  string *psVar3;
  shared_ptr<covenant::TerminalFactory> local_60;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  consume_blanks<covenant::StrParse>(input);
  do {
    uVar2 = (ulong)input->idx;
    if ((input->str)._M_string_length <= uVar2) {
      return;
    }
    cVar1 = (input->str)._M_dataplus._M_p[uVar2];
    if (cVar1 == ')') {
      return;
    }
    if ((input->str)._M_dataplus._M_p[uVar2] == ';') {
      consume_comment<covenant::StrParse>(input);
    }
    else {
      if ((input->str)._M_dataplus._M_p[uVar2] != '(') {
        psVar3 = (string *)__cxa_allocate_exception(0x20);
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"make sure CFG is enclosed between parenthesis","");
        *(string **)psVar3 = psVar3 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar3,local_50,local_50 + local_48);
        __cxa_throw(psVar3,&error::typeinfo,error::~error);
      }
      consume_blanks<covenant::StrParse>(input);
      local_60.px = tfac->px;
      local_60.pn.pi_ = (tfac->pn).pi_;
      if (local_60.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_60.pn.pi_)->use_count_ = (local_60.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      parse_constraint<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
                (p,input,&local_60);
      boost::detail::shared_count::~shared_count(&local_60.pn);
      consume_blanks<covenant::StrParse>(input);
    }
  } while (cVar1 != ')');
  return;
}

Assistant:

void parse_problem(CFGProblem& p, In& input, TerminalFactory tfac)
{

  consume_blanks(input);
  while(!input.empty())
  {
    char c = input.peek();
    // gross fix if the last constraint does not finish with some blank
    if (input.peek() == ')') break;

    if(c == ';')
    {
      // Comment line.
      consume_comment(input);
    } 
    else 
    {
      if (input.peek() != '(')
        throw error("make sure CFG is enclosed between parenthesis");

      consume_blanks(input);
      parse_constraint(p, input, tfac);
      consume_blanks(input);
    }
  }
}